

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_AddItemToObjectCS(cJSON *object,char *string,cJSON *item)

{
  uint uVar1;
  
  if (string == (char *)0x0 || item == (cJSON *)0x0) {
    return;
  }
  uVar1 = item->type;
  if (((uVar1 >> 9 & 1) == 0) && (item->string != (char *)0x0)) {
    (*global_hooks.deallocate)(item->string);
    uVar1 = item->type;
  }
  item->string = string;
  item->type = uVar1 | 0x200;
  cJSON_AddItemToArray(object,item);
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemToObjectCS(cJSON *object, const char *string, cJSON *item)
{
    if ((item == NULL) || (string == NULL))
    {
        return;
    }
    if (!(item->type & cJSON_StringIsConst) && item->string)
    {
        global_hooks.deallocate(item->string);
    }
    item->string = (char*)string;
    item->type |= cJSON_StringIsConst;
    cJSON_AddItemToArray(object, item);
}